

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O2

int CfdFreeCombinePubkeyHandle(void *handle,void *combine_handle)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  CfdCapiCombinePubkey *combine_struct;
  allocator local_39;
  string local_38;
  
  cfd::Initialize();
  if ((combine_handle != (void *)0x0) &&
     (this = *(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               **)((long)combine_handle + 0x10),
     this != (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x0)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(this);
    operator_delete(this);
    *(undefined8 *)((long)combine_handle + 0x10) = 0;
  }
  std::__cxx11::string::string((string *)&local_38,"CombinePubkey",&local_39);
  cfd::capi::FreeBuffer(combine_handle,&local_38,0x18);
  std::__cxx11::string::~string((string *)&local_38);
  return 0;
}

Assistant:

int CfdFreeCombinePubkeyHandle(void* handle, void* combine_handle) {
  try {
    cfd::Initialize();
    if (combine_handle != nullptr) {
      CfdCapiCombinePubkey* combine_struct =
          static_cast<CfdCapiCombinePubkey*>(combine_handle);
      if (combine_struct->pubkey_list != nullptr) {
        delete combine_struct->pubkey_list;
        combine_struct->pubkey_list = nullptr;
      }
    }
    FreeBuffer(
        combine_handle, kPrefixCombinePubkey, sizeof(CfdCapiCombinePubkey));
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return CfdErrorCode::kCfdUnknownError;
}